

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Vec_Int_t * Gia_ManProfileHash(Gia_Man_t *p,Vec_Int_t *vCode,Vec_Int_t *vCodeOffsets)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  int *piVar4;
  Gia_Man_t *p_01;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Gia_Man_t *p_02;
  int iVar10;
  
  iVar10 = p->nObjs;
  p_00 = (Gia_Man_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar3 = iVar10;
  }
  *(int *)((long)&p_00->pName + 4) = 0;
  *(int *)&p_00->pName = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 * 4);
  }
  p_00->pSpec = (char *)piVar4;
  p_01 = (Gia_Man_t *)calloc(1,0x28);
  uVar9 = iVar10 - 1U;
  while( true ) {
    do {
      uVar8 = uVar9;
      uVar9 = uVar8 + 1;
    } while ((uVar8 & 1) != 0);
    if (uVar9 < 9) break;
    iVar7 = 5;
    while (uVar9 % (iVar7 - 2U) != 0) {
      uVar2 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (uVar9 < uVar2) goto LAB_006f07fd;
    }
  }
LAB_006f07fd:
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar2 = uVar9;
  if (uVar8 < 0xf) {
    uVar2 = 0x10;
  }
  piVar6 = (int *)0x0;
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar2;
  piVar4 = (int *)malloc((long)(int)uVar2 << 2);
  pVVar5->pArray = piVar4;
  pVVar5->nSize = uVar9;
  memset(piVar4,0xff,(long)(int)uVar9 << 2);
  p_01->pName = (char *)pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar7 = iVar10 * 4;
  if (iVar10 * 4 - 1U < 0xf) {
    iVar7 = 0x10;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar7;
  if (iVar7 != 0) {
    piVar6 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar5->pArray = piVar6;
  p_01->pSpec = (char *)pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar5->pArray = piVar4;
  *(Vec_Int_t **)&p_01->nRegs = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar5->pArray = piVar4;
  p_02 = p_01;
  Hsh_VecManAdd((Hsh_VecMan_t *)p_01,pVVar5);
  if (0 < p->nObjs) {
    iVar10 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManProfileCollect(p_02,iVar10,vCode,vCodeOffsets,pVVar5);
      iVar3 = Hsh_VecManAdd((Hsh_VecMan_t *)p_01,pVVar5);
      p_02 = p_00;
      Vec_IntPush((Vec_Int_t *)p_00,iVar3);
      iVar10 = iVar10 + 1;
    } while (iVar10 < p->nObjs);
  }
  pVVar1 = (Vec_Int_t *)p_01->pName;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = (Vec_Int_t *)p_01->pSpec;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = *(Vec_Int_t **)&p_01->nRegs;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  free(p_01);
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  free(pVVar5);
  if (*(int *)((long)&p_00->pName + 4) == p->nObjs) {
    return (Vec_Int_t *)p_00;
  }
  __assert_fail("Vec_IntSize(vRes) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMuxes.c"
                ,0x309,"Vec_Int_t *Gia_ManProfileHash(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_ManProfileHash( Gia_Man_t * p, Vec_Int_t * vCode, Vec_Int_t * vCodeOffsets )
{
    Hsh_VecMan_t * pHash;
    Vec_Int_t * vRes, * vArray;
    Gia_Obj_t * pObj;
    int i;
    vRes = Vec_IntAlloc( Gia_ManObjNum(p) );
    pHash = Hsh_VecManStart( Gia_ManObjNum(p) );
    // add empty entry
    vArray = Vec_IntAlloc( 100 );
    Hsh_VecManAdd( pHash, vArray );
    // iterate through the entries
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
        Vec_IntPush( vRes, Hsh_VecManAdd( pHash, vArray ) );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vArray );
    assert( Vec_IntSize(vRes) == Gia_ManObjNum(p) );
    return vRes;
}